

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_string_with_u32string(void)

{
  undefined1 local_549;
  basic_variable<std::allocator<char>_> local_548;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4db [2];
  undefined1 local_4d9;
  basic_variable<std::allocator<char>_> local_4d8;
  basic_variable<std::allocator<char>_> local_4a8;
  undefined1 local_46b [2];
  undefined1 local_469;
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  undefined1 local_3fb [2];
  undefined1 local_3f9;
  basic_variable<std::allocator<char>_> local_3f8;
  basic_variable<std::allocator<char>_> local_3c8;
  undefined1 local_38b [2];
  undefined1 local_389;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  undefined1 local_2ab [2];
  undefined1 local_2a9;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_23b [2];
  undefined1 local_239;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"alpha");
  local_a[0] = trial::dynamic::operator<(&local_48,&local_78);
  local_85[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") < variable(U\"alpha\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c04,"void relational_suite::compare_string_with_u32string()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b8,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e8,L"alpha");
  local_87[0] = trial::dynamic::operator<=(&local_b8,&local_e8);
  local_e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") <= variable(U\"alpha\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c05,"void relational_suite::compare_string_with_u32string()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_128,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,L"alpha");
  local_eb[0] = trial::dynamic::operator>(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") > variable(U\"alpha\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c06,"void relational_suite::compare_string_with_u32string()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1c8,L"alpha");
  local_15b[0] = trial::dynamic::operator>=(&local_198,&local_1c8);
  local_1c9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") >= variable(U\"alpha\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c07,"void relational_suite::compare_string_with_u32string()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_208,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_238,L"zulu");
  local_1cb[0] = trial::dynamic::operator<(&local_208,&local_238);
  local_239 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") < variable(U\"zulu\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c09,"void relational_suite::compare_string_with_u32string()",local_1cb,&local_239);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_278,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2a8,L"zulu");
  local_23b[0] = trial::dynamic::operator<=(&local_278,&local_2a8);
  local_2a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") <= variable(U\"zulu\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c0a,"void relational_suite::compare_string_with_u32string()",local_23b,&local_2a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,L"zulu");
  local_2ab[0] = trial::dynamic::operator>(&local_2e8,&local_318);
  local_319 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") > variable(U\"zulu\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c0b,"void relational_suite::compare_string_with_u32string()",local_2ab,&local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_358,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_388,L"zulu");
  local_31b[0] = trial::dynamic::operator>=(&local_358,&local_388);
  local_389 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") >= variable(U\"zulu\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c0c,"void relational_suite::compare_string_with_u32string()",local_31b,&local_389);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3c8,"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3f8,L"alpha");
  local_38b[0] = trial::dynamic::operator<(&local_3c8,&local_3f8);
  local_3f9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"zulu\") < variable(U\"alpha\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c0e,"void relational_suite::compare_string_with_u32string()",local_38b,&local_3f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_438,"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_468,L"alpha");
  local_3fb[0] = trial::dynamic::operator<=(&local_438,&local_468);
  local_469 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"zulu\") <= variable(U\"alpha\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c0f,"void relational_suite::compare_string_with_u32string()",local_3fb,&local_469);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4a8,"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4d8,L"alpha");
  local_46b[0] = trial::dynamic::operator>(&local_4a8,&local_4d8);
  local_4d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"zulu\") > variable(U\"alpha\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c10,"void relational_suite::compare_string_with_u32string()",local_46b,&local_4d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_518,"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_548,L"alpha");
  local_4db[0] = trial::dynamic::operator>=(&local_518,&local_548);
  local_549 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"zulu\") >= variable(U\"alpha\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c11,"void relational_suite::compare_string_with_u32string()",local_4db,&local_549);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  return;
}

Assistant:

void compare_string_with_u32string()
{
    // string is always lesser than u32string
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") < variable(U"alpha"), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") <= variable(U"alpha"), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") > variable(U"alpha"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") >= variable(U"alpha"), false);

    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") < variable(U"zulu"), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") <= variable(U"zulu"), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") > variable(U"zulu"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") >= variable(U"zulu"), false);

    TRIAL_PROTOCOL_TEST_EQUAL(variable("zulu") < variable(U"alpha"), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("zulu") <= variable(U"alpha"), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("zulu") > variable(U"alpha"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("zulu") >= variable(U"alpha"), false);
}